

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O1

void presolve::dev_kkt_check::checkStationarityOfLagrangian
               (State *state,KktConditionDetails *details)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  char *pcVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  details->type = kStationarityOfLagrangian;
  details->max_violation = 0.0;
  details->sum_violation_2 = 0.0;
  details->checked = 0;
  details->violated = 0;
  if (0 < state->numCol) {
    lVar7 = 0;
    do {
      if ((state->flagCol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar7] != 0) {
        details->checked = details->checked + 1;
        dVar1 = (state->colCost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        dVar10 = (state->colDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar7];
        dVar9 = dVar1 - dVar10;
        dVar1 = (-dVar10 - (dVar9 - dVar1)) + (dVar1 - (dVar9 - (dVar9 - dVar1))) + 0.0;
        iVar2 = (state->Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        lVar4 = (long)iVar2;
        iVar3 = (state->Aend->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        if (iVar2 < iVar3) {
          dVar10 = dVar9;
          do {
            iVar2 = (state->Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar4];
            dVar9 = dVar10;
            if ((state->flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar2] != 0) {
              dVar8 = (state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[iVar2] *
                      (state->Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar4];
              dVar9 = dVar10 - dVar8;
              dVar1 = dVar1 + (-dVar8 - (dVar9 - dVar10)) + (dVar10 - (dVar9 - (dVar9 - dVar10)));
            }
            lVar4 = lVar4 + 1;
            dVar10 = dVar9;
          } while (iVar3 != lVar4);
        }
        dVar8 = ABS(dVar9 + dVar1);
        dVar10 = 0.0;
        if (1e-07 < dVar8) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Column ",7);
          poVar5 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," fails stationary of Lagrangian: dL/dx",0x26);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
          poVar5 = std::ostream::_M_insert<double>(dVar9 + dVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", rather than zero.",0x13);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          dVar10 = dVar8;
        }
        if (0.0 < dVar10) {
          details->violated = details->violated + 1;
          details->sum_violation_2 = dVar10 * dVar10 + details->sum_violation_2;
          if (details->max_violation <= dVar10 && dVar10 != details->max_violation) {
            details->max_violation = dVar10;
          }
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < state->numCol);
  }
  if (details->violated == 0) {
    pcVar6 = "Stationarity of Lagrangian.\n";
    lVar7 = 0x1c;
  }
  else {
    pcVar6 = "KKT check error: Lagrangian is not stationary.\n";
    lVar7 = 0x2f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar7);
  return;
}

Assistant:

void checkStationarityOfLagrangian(const State& state,
                                   KktConditionDetails& details) {
  details.type = KktCondition::kStationarityOfLagrangian;
  details.checked = 0;
  details.violated = 0;
  details.max_violation = 0.0;
  details.sum_violation_2 = 0.0;

  // A'y + c - z = 0
  for (int j = 0; j < state.numCol; j++) {
    if (state.flagCol[j]) {
      details.checked++;
      double infeas = 0;

      HighsCDouble lagrV = HighsCDouble(state.colCost[j]) - state.colDual[j];
      for (int k = state.Astart[j]; k < state.Aend[j]; k++) {
        const int row = state.Aindex[k];
        assert(row >= 0 && row < state.numRow);
        if (state.flagRow[row])
          lagrV = lagrV - state.rowDual[row] * state.Avalue[k];
      }

      if (fabs(double(lagrV)) > tol) {
        if (dev_print == 1)
          std::cout << "Column " << j
                    << " fails stationary of Lagrangian: dL/dx" << j << " = "
                    << double(lagrV) << ", rather than zero." << std::endl;
        infeas = fabs(double(lagrV));
      }

      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  if (details.violated == 0) {
    if (dev_print == 1) std::cout << "Stationarity of Lagrangian.\n";
  } else {
    if (dev_print == 1)
      std::cout << "KKT check error: Lagrangian is not stationary.\n";
  }
}